

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tutorial.cpp
# Opt level: O0

void __thiscall
LibraryBook::LibraryBook
          (LibraryBook *this,string *title_,string *author_,int available_copies_,string *language_,
          int pages_,string *isbn_)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *in_R8;
  undefined4 in_R9D;
  string *in_stack_00000008;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  *(undefined4 *)(in_RDI + 0x40) = in_ECX;
  std::__cxx11::string::string(in_RDI + 0x48,in_R8);
  *(undefined4 *)(in_RDI + 0x68) = in_R9D;
  std::__cxx11::string::string(in_RDI + 0x70,in_stack_00000008);
  return;
}

Assistant:

LibraryBook(std::string title_,
                std::string author_,
                int available_copies_,
                std::string language_,
                int pages_,
                std::string isbn_)
        : title(title_)
        , author(author_)
        , available_copies(available_copies_)
        , language(language_)
        , pages(pages_)
        , isbn(isbn_)
    {
    }